

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::ChooseConfigCase::executeTest
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes,bool checkOrder)

{
  pointer *pppvVar1;
  EGLenum attrib;
  EGLDisplay pvVar2;
  bool bVar3;
  deUint32 dVar4;
  deBool dVar5;
  _anonymous_namespace_ *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  pointer ppVar7;
  reference pvVar8;
  reference ppvVar9;
  size_type sVar10;
  vector<void_*,_std::allocator<void_*>_> *configs;
  bool local_b5c;
  bool local_b5b;
  MessageBuilder local_aa0;
  MessageBuilder local_920;
  MessageBuilder local_7a0;
  bool local_61a;
  undefined1 local_619;
  bool isMatch;
  iterator iStack_618;
  bool isExactMatch;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_610;
  set<void_*,_std::less<void_*>,_std::allocator<void_*>_> local_608;
  void **local_5d8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_5d0;
  set<void_*,_std::less<void_*>,_std::allocator<void_*>_> local_5c8;
  byte local_591;
  undefined1 local_590 [7];
  bool isSetMatch;
  MessageBuilder local_570;
  string local_3f0;
  MessageBuilder local_3d0;
  int local_24c;
  undefined1 local_248 [4];
  EGLint numConfigs;
  vector<void_*,_std::allocator<void_*>_> referenceConfigs;
  vector<void_*,_std::allocator<void_*>_> resultConfigs;
  __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_210;
  __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_208;
  const_iterator i_1;
  value_type_conflict1 local_7c;
  pair<unsigned_int,_int> *local_78;
  uint local_5c;
  __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_58;
  __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_50;
  const_iterator i;
  vector<int,_std::allocator<int>_> attribList;
  TestLog *log;
  Library *egl;
  bool checkOrder_local;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
  *attributes_local;
  ChooseConfigCase *this_local;
  
  this_00 = (_anonymous_namespace_ *)EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx)
  ;
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  local_50._M_current =
       (pair<unsigned_int,_int> *)
       std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
       begin(attributes);
  while( true ) {
    local_58._M_current =
         (pair<unsigned_int,_int> *)
         std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
         end(attributes);
    bVar3 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar3) break;
    ppVar7 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->(&local_50);
    local_5c = ppVar7->first;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,(value_type_conflict1 *)&local_5c);
    ppVar7 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->(&local_50);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,&ppVar7->second);
    local_78 = (pair<unsigned_int,_int> *)
               __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
               ::operator++(&local_50,0);
  }
  local_7c = 0x3038;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&i,&local_7c);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&i_1,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)&i_1,(char (*) [12])"Attributes:");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_1);
  local_208._M_current =
       (pair<unsigned_int,_int> *)
       std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
       begin(attributes);
  while( true ) {
    local_210._M_current =
         (pair<unsigned_int,_int> *)
         std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
         end(attributes);
    bVar3 = __gnu_cxx::operator!=(&local_208,&local_210);
    if (!bVar3) break;
    ppVar7 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->(&local_208);
    attrib = ppVar7->first;
    ppVar7 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->(&local_208);
    anon_unknown_7::logConfigAttrib(this_01,attrib,ppVar7->second);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
    ::operator++(&local_208,0);
  }
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_248);
  local_24c = 0;
  do {
    pvVar2 = this->m_display;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,0);
    configs = (vector<void_*,_std::allocator<void_*>_> *)0x0;
    (**(code **)(*(long *)this_00 + 0x10))(this_00,pvVar2,pvVar8,0,0,&local_24c);
    dVar4 = (**(code **)(*(long *)this_00 + 0xf8))();
    eglu::checkError(dVar4,"chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                     ,0xba);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  std::vector<void_*,_std::allocator<void_*>_>::resize
            ((vector<void_*,_std::allocator<void_*>_> *)
             &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)local_24c);
  if (0 < local_24c) {
    do {
      pvVar2 = this->m_display;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,0);
      pppvVar1 = &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)pppvVar1,0);
      sVar10 = std::vector<void_*,_std::allocator<void_*>_>::size
                         ((vector<void_*,_std::allocator<void_*>_> *)pppvVar1);
      configs = (vector<void_*,_std::allocator<void_*>_> *)(sVar10 & 0xffffffff);
      (**(code **)(*(long *)this_00 + 0x10))(this_00,pvVar2,pvVar8,ppvVar9,configs,&local_24c);
      dVar4 = (**(code **)(*(long *)this_00 + 0xf8))();
      eglu::checkError(dVar4,
                       "chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                       ,0xbe);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  chooseConfigReference
            ((Library *)this_00,this->m_display,(vector<void_*,_std::allocator<void_*>_> *)local_248
             ,attributes);
  tcu::TestLog::operator<<(&local_3d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [13])"Expected:\n  ");
  (anonymous_namespace)::configListToString_abi_cxx11_
            (&local_3f0,this_00,(Library *)&this->m_display,(EGLDisplay *)local_248,configs);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3f0);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_3f0);
  tcu::MessageBuilder::~MessageBuilder(&local_3d0);
  tcu::TestLog::operator<<(&local_570,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_570,(char (*) [8])"Got:\n  ");
  (anonymous_namespace)::configListToString_abi_cxx11_
            ((string *)local_590,this_00,(Library *)&this->m_display,
             &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,configs);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_590);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_590);
  tcu::MessageBuilder::~MessageBuilder(&local_570);
  pppvVar1 = &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_5d0._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)pppvVar1);
  local_5d8 = (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                                 ((vector<void_*,_std::allocator<void_*>_> *)pppvVar1);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)&local_5c8,local_5d0,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)local_5d8);
  local_610._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)local_248);
  iStack_618 = std::vector<void_*,_std::allocator<void_*>_>::end
                         ((vector<void_*,_std::allocator<void_*>_> *)local_248);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)&local_608,local_610,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             iStack_618._M_current);
  bVar3 = std::operator==(&local_5c8,&local_608);
  std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::~set(&local_608);
  std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::~set(&local_5c8);
  local_591 = bVar3;
  local_619 = anon_unknown_7::configListEqual
                        ((Library *)this_00,&this->m_display,
                         (vector<void_*,_std::allocator<void_*>_> *)
                         &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<void_*,_std::allocator<void_*>_> *)local_248);
  local_b5b = false;
  if ((local_591 & 1) != 0) {
    local_b5c = (bool)local_619;
    if (!checkOrder) {
      local_b5c = true;
    }
    local_b5b = local_b5c;
  }
  local_61a = local_b5b;
  if (local_b5b == false) {
    if ((local_591 & 1) == 0) {
      tcu::TestLog::operator<<(&local_920,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_920,(char (*) [26])"Fail, configs don\'t match");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_920);
    }
    else if (!(bool)local_619) {
      tcu::TestLog::operator<<(&local_aa0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_aa0,(char (*) [47])"Fail, got correct configs but in invalid order"
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_aa0);
    }
  }
  else {
    tcu::TestLog::operator<<(&local_7a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_7a0,(char (*) [5])0x585733);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7a0);
  }
  if ((local_61a & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_248);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &referenceConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return;
}

Assistant:

void executeTest (const std::vector<std::pair<EGLenum, EGLint> >& attributes, bool checkOrder)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// Build attributes for EGL
		vector<EGLint> attribList;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
		{
			attribList.push_back(i->first);
			attribList.push_back(i->second);
		}
		attribList.push_back(EGL_NONE);

		// Print attribList to log
		log << TestLog::Message << "Attributes:" << TestLog::EndMessage;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
			logConfigAttrib(log, i->first, i->second);

		std::vector<EGLConfig>	resultConfigs;
		std::vector<EGLConfig>	referenceConfigs;

		// Query from EGL implementation
		{
			EGLint numConfigs = 0;
			EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs));
			resultConfigs.resize(numConfigs);

			if (numConfigs > 0)
				EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs));
		}

		// Build reference
		chooseConfigReference(egl, m_display, referenceConfigs, attributes);

		log << TestLog::Message << "Expected:\n  " << configListToString(egl, m_display, referenceConfigs) << TestLog::EndMessage;
		log << TestLog::Message << "Got:\n  " << configListToString(egl, m_display, resultConfigs) << TestLog::EndMessage;

		bool isSetMatch		= (set<EGLConfig>(resultConfigs.begin(), resultConfigs.end()) == set<EGLConfig>(referenceConfigs.begin(), referenceConfigs.end()));
		bool isExactMatch	= configListEqual(egl, m_display, resultConfigs, referenceConfigs);
		bool isMatch		= isSetMatch && (checkOrder ? isExactMatch : true);

		if (isMatch)
			log << TestLog::Message << "Pass" << TestLog::EndMessage;
		else if (!isSetMatch)
			log << TestLog::Message << "Fail, configs don't match" << TestLog::EndMessage;
		else if (!isExactMatch)
			log << TestLog::Message << "Fail, got correct configs but in invalid order" << TestLog::EndMessage;

		if (!isMatch)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}